

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O0

uint32 __thiscall Clasp::SharedLiterals::simplify(SharedLiterals *this,Solver *s)

{
  bool bVar1;
  byte bVar2;
  uint32 uVar3;
  Solver *in_RSI;
  SharedLiterals *in_RDI;
  Literal *c;
  ValueRep v;
  Literal *e;
  Literal *r;
  uint32 newSize;
  bool removeFalse;
  uint in_stack_ffffffffffffffac;
  Solver *this_00;
  SharedLiterals *local_38;
  SharedLiterals *local_20;
  uint32 local_18;
  
  bVar1 = unique((SharedLiterals *)0x229c3d);
  local_18 = 0;
  local_38 = in_RDI + 1;
  uVar3 = size(in_RDI);
  local_20 = local_38;
  do {
    if (local_20 == (SharedLiterals *)(&in_RDI[1].refCount_ + uVar3)) {
LAB_00229d55:
      if ((bVar1) && (uVar3 = size(in_RDI), local_18 != uVar3)) {
        in_RDI->size_type_ = local_18 << 2 | in_RDI->size_type_ & 3;
      }
      return local_18;
    }
    this_00 = in_RSI;
    Literal::var((Literal *)local_20);
    bVar2 = Solver::value(this_00,in_stack_ffffffffffffffac);
    if (bVar2 == 0) {
      if (local_38 != local_20) {
        (local_38->refCount_).super___atomic_base<int>._M_i =
             (local_20->refCount_).super___atomic_base<int>._M_i;
      }
      local_38 = (SharedLiterals *)&local_38->size_type_;
      local_18 = local_18 + 1;
    }
    else {
      in_stack_ffffffffffffffac = (uint)bVar2;
      bVar2 = trueValue((Literal *)0x229d10);
      if (in_stack_ffffffffffffffac == bVar2) {
        local_18 = 0;
        goto LAB_00229d55;
      }
      if (!bVar1) {
        local_38 = (SharedLiterals *)&local_38->size_type_;
      }
    }
    local_20 = (SharedLiterals *)&local_20->size_type_;
  } while( true );
}

Assistant:

uint32 SharedLiterals::simplify(Solver& s) {
	bool   removeFalse = unique();
	uint32   newSize   = 0;
	Literal* r         = lits_;
	Literal* e         = lits_+size();
	ValueRep v;
	for (Literal* c = r; r != e; ++r) {
		if ( (v = s.value(r->var())) == value_free ) {
			if (c != r) *c = *r;
			++c; ++newSize;
		}
		else if (v == trueValue(*r)) {
			newSize = 0; break;
		}
		else if (!removeFalse) ++c;
	}
	if (removeFalse && newSize != size()) {
		size_type_ = (newSize << 2) | (size_type_ & uint32(3));
	}
	return newSize;
}